

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

bool __thiscall function::hasSameName(function *this,string *varName)

{
  int iVar1;
  size_type sVar2;
  size_type sVar3;
  string name;
  key_type local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)varName);
  for (sVar3 = 0; local_40._M_string_length != sVar3; sVar3 = sVar3 + 1) {
    iVar1 = tolower((int)local_40._M_dataplus._M_p[sVar3]);
    local_40._M_dataplus._M_p[sVar3] = (char)iVar1;
  }
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&this->sameName,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return sVar2 != 0;
}

Assistant:

bool function::hasSameName(const string &varName) {
    string name=varName;
    transform(name.begin(), name.end(), name.begin(), ::tolower);
    return sameName.count(name) > 0;
}